

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  void *__s1;
  size_t __n;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *in_RDX;
  ulong unaff_RBP;
  Iterator iter;
  long local_78;
  long local_70;
  Iterator local_68;
  SearchKey local_50;
  char *local_48;
  undefined1 *local_40;
  
  local_40 = (undefined1 *)&local_78;
  local_48 = params[4] + 4;
  local_78 = *(long *)params;
  local_70 = *(long *)(params[1] + 1) - local_78 >> 4;
  local_50._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236a00;
  _::BTreeImpl::search(&local_68,(BTreeImpl *)(params[5] + 5),&local_50);
  if ((ulong)local_68.row != 0xe) {
    uVar1 = (local_68.leaf)->rows[local_68.row].i;
    unaff_RBP = (ulong)uVar1;
    if (uVar1 != 0) {
      unaff_RBP = (ulong)(uVar1 - 1);
      __s1 = *(void **)(local_78 + unaff_RBP * 0x10);
      __n = *(size_t *)(local_78 + 8 + unaff_RBP * 0x10);
      sVar4 = strlen(in_RDX);
      if (__n == sVar4 + 1) {
        bVar2 = true;
        if (__n == 0) goto LAB_0016a0a8;
        iVar3 = bcmp(__s1,in_RDX,__n);
        if (iVar3 == 0) goto LAB_0016a0a8;
      }
    }
  }
  bVar2 = false;
LAB_0016a0a8:
  lVar5 = 0;
  if (bVar2) {
    lVar5 = unaff_RBP * 0x10 + *(long *)params;
  }
  *(long *)this = lVar5;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}